

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O0

string * format_abi_cxx11_(string *__return_storage_ptr__,double value,int width,int precision)

{
  long local_1a8;
  stringstream s;
  ostream local_198 [376];
  int local_20;
  int local_1c;
  int precision_local;
  int width_local;
  double value_local;
  
  local_20 = precision;
  local_1c = width;
  _precision_local = value;
  value_local = (double)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1a8);
  std::ios_base::width((ios_base *)((long)&local_1a8 + *(long *)(local_1a8 + -0x18)),(long)local_1c)
  ;
  std::ios_base::precision
            ((ios_base *)((long)&local_1a8 + *(long *)(local_1a8 + -0x18)),(long)local_20);
  std::ostream::operator<<(local_198,_precision_local);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1a8);
  return __return_storage_ptr__;
}

Assistant:

const std::string format (double value, int width, int precision)
{
  std::stringstream s;
  s.width (width);
  s.precision (precision);
  s << value;
  return s.str ();
}